

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  ImageBuffer *buffer;
  SDL_Window *window_00;
  char *local_60;
  SDL_Window *window;
  ImageBuffer *buf;
  Options options;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  options._40_8_ = argv;
  default_options();
  _Var1 = parse_args(argc,(char **)options._40_8_,(Options *)&buf);
  if (_Var1) {
    buffer = create_buffer((int)buf,(int)options.width);
    if (options.max_seconds == 0) {
      local_60 = "Pathtracer";
    }
    else {
      local_60 = (char *)options.max_seconds;
    }
    window_00 = create_window(local_60,(int)buf,(int)options.width);
    render_buffer(window_00,buffer,2.2);
    render_stuff(buffer,window_00,(int)options.height,(int)options.max_samples,
                 (_Bool)((byte)options.output_file & 1));
    printf("\n");
    if (options.max_seconds == 0) {
      write_image_file(buffer,"output/latest.png",2.2);
    }
    else {
      write_image_file(buffer,(char *)options.max_seconds,2.2);
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
    /* TriangleMesh suzanne; */
    /* read_obj_file(&suzanne, "res/suzanne_250k.obj"); */

    /* for (int i = 0; i < suzanne.triangle_count; i++) { */
    /* 	printf("Triangle %d:\n", i); */
    /* 	Triangle* tri = &suzanne.triangles[i]; */
    /* 	for (int j = 0; j < 3; j++) { */
    /* 	    printf("  v %6.3f %6.3f %6.3f\t", tri->vertices[j].x, tri->vertices[j].y, tri->vertices[j].z); */
    /* 	    printf("  n %6.3f %6.3f %6.3f\n", tri->vertex_normals[j].x, tri->vertex_normals[j].y, tri->vertex_normals[j].z); */
    /* 	} */
    /* } */
    
    /* return 0; */
    
    Options options = default_options();
    if (!parse_args(argc, argv, &options)) {
        return -1;
    }
    ImageBuffer* buf = create_buffer(options.width, options.height);

    SDL_Window* window = create_window(options.output_file ? options.output_file : "Pathtracer", options.width, options.height);

    render_buffer(window, buf, GAMMA);
    render_stuff(buf, window, options.max_samples, options.max_seconds, options.uniform_sampling);
    printf("\n");

    if (options.output_file)
        write_image_file(buf, options.output_file, GAMMA);
    else
        write_image_file(buf, "output/latest.png", GAMMA);
}